

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O0

void threshold_tilde_set(t_threshold_tilde *x,t_floatarg hithresh,t_floatarg hideadtime,
                        t_floatarg lothresh,t_floatarg lodeadtime)

{
  t_float local_1c;
  t_floatarg lodeadtime_local;
  t_floatarg lothresh_local;
  t_floatarg hideadtime_local;
  t_floatarg hithresh_local;
  t_threshold_tilde *x_local;
  
  local_1c = lothresh;
  if (hithresh < lothresh) {
    local_1c = hithresh;
  }
  x->x_hithresh = hithresh;
  x->x_hideadtime = hideadtime;
  x->x_lothresh = local_1c;
  x->x_lodeadtime = lodeadtime;
  return;
}

Assistant:

static void threshold_tilde_set(t_threshold_tilde *x,
    t_floatarg hithresh, t_floatarg hideadtime,
    t_floatarg lothresh, t_floatarg lodeadtime)
{
    if (lothresh > hithresh)
        lothresh = hithresh;
    x->x_hithresh = hithresh;
    x->x_hideadtime = hideadtime;
    x->x_lothresh = lothresh;
    x->x_lodeadtime = lodeadtime;
}